

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> * __thiscall
kj::_::NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>::emplace<>
          (NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_> *this)

{
  NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>>(&(this->field_1).value);
  }
  ctor<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>>(&(this->field_1).value);
  this->isSet = true;
  return (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }